

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.h
# Opt level: O0

double projects::ipdg_stokes::post_processing::
       L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                 (shared_ptr<const_lf::mesh::Mesh> *mesh,
                 MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                 *f,anon_class_1_0_00000001 *qr_selector)

{
  element_type *mesh_00;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>_>
  __x;
  double dVar1;
  PredicateTrue local_61;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
  local_60;
  anon_class_1_0_00000001 *local_20;
  anon_class_1_0_00000001 *qr_selector_local;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  *f_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  
  local_20 = qr_selector;
  qr_selector_local = (anon_class_1_0_00000001 *)f;
  f_local = (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
             *)mesh;
  mesh_00 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh);
  lf::mesh::utils::
  squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>
            (&local_60,
             (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              *)qr_selector_local);
  __x = lf::fe::
        IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
                  (mesh_00,&local_60,local_20,&local_61,0);
  dVar1 = sqrt(__x);
  lf::mesh::utils::
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>_>
  ::~MeshFunctionUnary(&local_60);
  return dVar1;
}

Assistant:

double L2norm(const std::shared_ptr<const lf::mesh::Mesh> &mesh, const MF &f,
              const QR_SELECTOR &qr_selector) {
  return std::sqrt(lf::fe::IntegrateMeshFunction(
      *mesh, lf::mesh::utils::squaredNorm(f), qr_selector));
}